

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::FieldDescriptorProto::ByteSizeLong(FieldDescriptorProto *this)

{
  uint uVar1;
  int32_t iVar2;
  FieldDescriptorProto_Label value;
  FieldDescriptorProto_Type value_00;
  uint32_t *puVar3;
  string *psVar4;
  size_t sVar5;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  FieldDescriptorProto *this_;
  FieldDescriptorProto *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  puVar3 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar3;
  sStack_58 = (size_t)(int)((uint)((uVar1 & 0x100) != 0) * 3);
  if ((uVar1 & 0xff) != 0) {
    if ((uVar1 & 1) != 0) {
      psVar4 = _internal_name_abi_cxx11_(this);
      sVar5 = internal::WireFormatLite::StringSize(psVar4);
      sStack_58 = sVar5 + 1 + sStack_58;
    }
    if ((uVar1 & 2) != 0) {
      psVar4 = _internal_extendee_abi_cxx11_(this);
      sVar5 = internal::WireFormatLite::StringSize(psVar4);
      sStack_58 = sVar5 + 1 + sStack_58;
    }
    if ((uVar1 & 4) != 0) {
      psVar4 = _internal_type_name_abi_cxx11_(this);
      sVar5 = internal::WireFormatLite::StringSize(psVar4);
      sStack_58 = sVar5 + 1 + sStack_58;
    }
    if ((uVar1 & 8) != 0) {
      psVar4 = _internal_default_value_abi_cxx11_(this);
      sVar5 = internal::WireFormatLite::StringSize(psVar4);
      sStack_58 = sVar5 + 1 + sStack_58;
    }
    if ((uVar1 & 0x10) != 0) {
      psVar4 = _internal_json_name_abi_cxx11_(this);
      sVar5 = internal::WireFormatLite::StringSize(psVar4);
      sStack_58 = sVar5 + 1 + sStack_58;
    }
    if ((uVar1 & 0x20) != 0) {
      sVar5 = internal::WireFormatLite::MessageSize<google::protobuf::FieldOptions>
                        ((this->field_0)._impl_.options_);
      sStack_58 = sVar5 + 1 + sStack_58;
    }
    if ((uVar1 & 0x40) != 0) {
      iVar2 = _internal_number(this);
      sVar5 = internal::WireFormatLite::Int32SizePlusOne(iVar2);
      sStack_58 = sVar5 + sStack_58;
    }
    if ((uVar1 & 0x80) != 0) {
      iVar2 = _internal_oneof_index(this);
      sVar5 = internal::WireFormatLite::Int32SizePlusOne(iVar2);
      sStack_58 = sVar5 + sStack_58;
    }
  }
  if ((uVar1 & 0x600) != 0) {
    if ((uVar1 & 0x200) != 0) {
      value = _internal_label(this);
      sVar5 = internal::WireFormatLite::EnumSize(value);
      sStack_58 = sVar5 + 1 + sStack_58;
    }
    if ((uVar1 & 0x400) != 0) {
      value_00 = _internal_type(this);
      sVar5 = internal::WireFormatLite::EnumSize(value_00);
      sStack_58 = sVar5 + 1 + sStack_58;
    }
  }
  sVar5 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

::size_t FieldDescriptorProto::ByteSizeLong() const {
  const FieldDescriptorProto& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.FieldDescriptorProto)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += static_cast<bool>(0x00000100u & cached_has_bits) * 3;
  if ((cached_has_bits & 0x000000ffu) != 0) {
    // optional string name = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_name());
    }
    // optional string extendee = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_extendee());
    }
    // optional string type_name = 6;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_type_name());
    }
    // optional string default_value = 7;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_default_value());
    }
    // optional string json_name = 10;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_json_name());
    }
    // optional .google.protobuf.FieldOptions options = 8;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.options_);
    }
    // optional int32 number = 3;
    if ((cached_has_bits & 0x00000040u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_number());
    }
    // optional int32 oneof_index = 9;
    if ((cached_has_bits & 0x00000080u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_oneof_index());
    }
  }
  if ((cached_has_bits & 0x00000600u) != 0) {
    // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
    if ((cached_has_bits & 0x00000200u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_label());
    }
    // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
    if ((cached_has_bits & 0x00000400u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_type());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}